

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bus_test.c
# Opt level: O2

void test_bug1247(void)

{
  nng_err nVar1;
  int iVar2;
  nng_err num;
  char *pcVar3;
  char *pcVar4;
  nng_socket local_38;
  nng_socket local_34;
  nng_socket bus1;
  nng_socket bus2;
  
  nuts_scratch_addr("tcp",0x40,test_bug1247::nuts_addr_);
  nVar1 = nng_bus0_open(&local_38);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/bus0/bus_test.c"
                         ,0x191,"%s: expected success, got %s (%d)","nng_bus0_open(&bus1)",pcVar3,
                         nVar1);
  if (iVar2 != 0) {
    nVar1 = nng_bus0_open(&local_34);
    pcVar3 = nng_strerror(nVar1);
    iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                           "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/bus0/bus_test.c"
                           ,0x192,"%s: expected success, got %s (%d)","nng_bus0_open(&bus2)",pcVar3,
                           nVar1);
    if (iVar2 != 0) {
      nVar1 = nng_listen(local_38,test_bug1247::nuts_addr_,(nng_listener *)0x0,0);
      pcVar3 = nng_strerror(nVar1);
      iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                             "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/bus0/bus_test.c"
                             ,0x194,"%s: expected success, got %s (%d)",
                             "nng_listen(bus1, addr, NULL, 0)",pcVar3,nVar1);
      if (iVar2 != 0) {
        num = nng_listen(local_34,test_bug1247::nuts_addr_,(nng_listener *)0x0,0);
        pcVar3 = nng_strerror(NNG_EADDRINUSE);
        acutest_check_((uint)(num == NNG_EADDRINUSE),
                       "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/bus0/bus_test.c"
                       ,0x195,"%s fails with %s","nng_listen(bus2, addr, NULL, 0)",pcVar3,nVar1);
        pcVar3 = nng_strerror(NNG_EADDRINUSE);
        pcVar4 = nng_strerror(num);
        acutest_message_("%s: expected %s (%d), got %s (%d)","nng_listen(bus2, addr, NULL, 0)",
                         pcVar3,10,pcVar4,(ulong)num);
        nVar1 = nng_socket_close(local_34);
        pcVar3 = nng_strerror(nVar1);
        iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                               "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/bus0/bus_test.c"
                               ,0x197,"%s: expected success, got %s (%d)","nng_socket_close(bus2)",
                               pcVar3,nVar1);
        if (iVar2 != 0) {
          nVar1 = nng_socket_close(local_38);
          pcVar3 = nng_strerror(nVar1);
          iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/bus0/bus_test.c"
                                 ,0x198,"%s: expected success, got %s (%d)","nng_socket_close(bus1)"
                                 ,pcVar3,nVar1);
          if (iVar2 != 0) {
            return;
          }
        }
      }
    }
  }
  acutest_abort_();
}

Assistant:

static void
test_bug1247(void)
{
	nng_socket bus1, bus2;
	char      *addr;

	NUTS_ADDR(addr, "tcp");

	NUTS_PASS(nng_bus0_open(&bus1));
	NUTS_PASS(nng_bus0_open(&bus2));

	NUTS_PASS(nng_listen(bus1, addr, NULL, 0));
	NUTS_FAIL(nng_listen(bus2, addr, NULL, 0), NNG_EADDRINUSE);

	NUTS_CLOSE(bus2);
	NUTS_CLOSE(bus1);
}